

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateHeader(FileGenerator *this,Printer *printer)

{
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
  *this_00;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
  *this_01;
  bool bVar1;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar2;
  MessageGenerator *pMVar3;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar4;
  EnumGenerator *pEVar5;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *this_02;
  ServiceGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *this_04;
  ExtensionGenerator *this_05;
  FileDescriptor *pFVar6;
  int i;
  long lVar7;
  int i_1;
  int i_4;
  int i_9;
  string filename_identifier;
  string sStack_98;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
  *local_78;
  string local_70;
  string local_50;
  
  FilenameIdentifier(&local_50,*(string **)this->file_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n#define PROTOBUF_$filename_identifier$__INCLUDED\n\n#include <string>\n\n"
             ,(string *)0x16e55b,*(char **)this->file_,(string *)"filename_identifier");
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::SimpleItoa_abi_cxx11_((int)&sStack_98);
  google::protobuf::SimpleItoa_abi_cxx11_((int)&local_70);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please update\n#error your headers.\n#endif\n#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
             ,(string *)"min_header_version",(char *)&sStack_98,(string *)"protoc_version");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&sStack_98);
  google::protobuf::io::Printer::Print((char *)printer);
  if (0 < *(int *)(this->file_ + 0x48)) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  if ((*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) &&
     (bVar1 = HasEnumDefinitions(this->file_), bVar1)) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  bVar1 = HasGenericServices(this->file_);
  if (bVar1) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  if ((*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) && (0 < *(int *)(this->file_ + 0x48))) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  for (lVar7 = 0; lVar7 < *(int *)(this->file_ + 0x18); lVar7 = lVar7 + 1) {
    StripProto(&sStack_98,(string *)**(undefined8 **)(*(long *)(this->file_ + 0x20) + lVar7 * 8));
    google::protobuf::io::Printer::Print
              ((char *)printer,"#include \"$dependency$.pb.h\"\n",(string *)"dependency");
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  GenerateNamespaceOpeners(this,printer);
  GlobalAddDescriptorsName(&sStack_98,*(string **)this->file_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "\n// Internal implementation detail -- do not call these.\nvoid $dllexport_decl$ $adddescriptorsname$();\n"
             ,(string *)"adddescriptorsname",(char *)&sStack_98,(string *)"dllexport_decl");
  std::__cxx11::string::~string((string *)&sStack_98);
  GlobalAssignDescriptorsName(&sStack_98,*(string **)this->file_);
  GlobalShutdownFileName(&local_70,*(string **)this->file_);
  google::protobuf::io::Printer::Print
            ((char *)printer,"void $assigndescriptorsname$();\nvoid $shutdownfilename$();\n\n",
             (string *)"assigndescriptorsname",(char *)&sStack_98,(string *)"shutdownfilename");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&sStack_98);
  this_00 = &this->message_generators_;
  for (lVar7 = 0; lVar7 < *(int *)(this->file_ + 0x48); lVar7 = lVar7 + 1) {
    psVar2 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar7);
    pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar2);
    MessageGenerator::GenerateForwardDeclaration(pMVar3,printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  for (lVar7 = 0; pFVar6 = this->file_, lVar7 < *(int *)(pFVar6 + 0x48); lVar7 = lVar7 + 1) {
    psVar2 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar7);
    pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar2);
    MessageGenerator::GenerateEnumDefinitions(pMVar3,printer);
  }
  for (lVar7 = 0; lVar7 < *(int *)(pFVar6 + 0x58); lVar7 = lVar7 + 1) {
    psVar4 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
             ::operator[](&this->enum_generators_,lVar7);
    pEVar5 = internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->
                       (psVar4);
    EnumGenerator::GenerateDefinition(pEVar5,printer);
    pFVar6 = this->file_;
  }
  local_78 = &this->enum_generators_;
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  for (lVar7 = 0; lVar7 < *(int *)(this->file_ + 0x48); lVar7 = lVar7 + 1) {
    if (lVar7 != 0) {
      google::protobuf::io::Printer::Print((char *)printer);
      google::protobuf::io::Printer::Print((char *)printer);
      google::protobuf::io::Printer::Print((char *)printer);
    }
    psVar2 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar7);
    pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar2);
    MessageGenerator::GenerateClassDefinition(pMVar3,printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  bVar1 = HasGenericServices(this->file_);
  if (bVar1) {
    for (lVar7 = 0; lVar7 < *(int *)(this->file_ + 0x68); lVar7 = lVar7 + 1) {
      if (lVar7 != 0) {
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
      }
      this_02 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator[](&this->service_generators_,lVar7);
      this_03 = internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::operator->
                          (this_02);
      ServiceGenerator::GenerateDeclarations(this_03,printer);
    }
    google::protobuf::io::Printer::Print((char *)printer);
    google::protobuf::io::Printer::Print((char *)printer);
    google::protobuf::io::Printer::Print((char *)printer);
  }
  for (lVar7 = 0; lVar7 < *(int *)(this->file_ + 0x78); lVar7 = lVar7 + 1) {
    this_04 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar7);
    this_05 = internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::operator->
                        (this_04);
    ExtensionGenerator::GenerateDeclaration(this_05,printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  for (lVar7 = 0; lVar7 < *(int *)(this->file_ + 0x48); lVar7 = lVar7 + 1) {
    if (lVar7 != 0) {
      google::protobuf::io::Printer::Print((char *)printer);
      google::protobuf::io::Printer::Print((char *)printer);
    }
    psVar2 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar7);
    pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar2);
    MessageGenerator::GenerateInlineMethods(pMVar3,printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  GenerateNamespaceClosers(this,printer);
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    google::protobuf::io::Printer::Print((char *)printer);
    this_01 = local_78;
    for (lVar7 = 0; pFVar6 = this->file_, lVar7 < *(int *)(pFVar6 + 0x48); lVar7 = lVar7 + 1) {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](this_00,lVar7);
      pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                         (psVar2);
      MessageGenerator::GenerateGetEnumDescriptorSpecializations(pMVar3,printer);
    }
    for (lVar7 = 0; lVar7 < *(int *)(pFVar6 + 0x58); lVar7 = lVar7 + 1) {
      psVar4 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](this_01,lVar7);
      pEVar5 = internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->
                         (psVar4);
      EnumGenerator::GenerateGetEnumDescriptorSpecializations(pEVar5,printer);
      pFVar6 = this->file_;
    }
    google::protobuf::io::Printer::Print((char *)printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print
            ((char *)printer,"#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
             (string *)"filename_identifier");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer* printer) {
  string filename_identifier = FilenameIdentifier(file_->name());

  // Generate top of header.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"
    "#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n"
    "#define PROTOBUF_$filename_identifier$__INCLUDED\n"
    "\n"
    "#include <string>\n"
    "\n",
    "filename", file_->name(),
    "filename_identifier", filename_identifier);


  printer->Print(
    "#include <google/protobuf/stubs/common.h>\n"
    "\n");

  // Verify the protobuf library header version is compatible with the protoc
  // version before going any further.
  printer->Print(
    "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n"
    "#error This file was generated by a newer version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please update\n"
    "#error your headers.\n"
    "#endif\n"
    "#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n"
    "#error This file was generated by an older version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please\n"
    "#error regenerate this file with a newer version of protoc.\n"
    "#endif\n"
    "\n",
    "min_header_version",
      SimpleItoa(protobuf::internal::kMinHeaderVersionForProtoc),
    "protoc_version", SimpleItoa(GOOGLE_PROTOBUF_VERSION));

  // OK, it's now safe to #include other files.
  printer->Print(
    "#include <google/protobuf/generated_message_util.h>\n");
  if (file_->message_type_count() > 0) {
    if (HasDescriptorMethods(file_)) {
      printer->Print(
        "#include <google/protobuf/message.h>\n");
    } else {
      printer->Print(
        "#include <google/protobuf/message_lite.h>\n");
    }
  }
  printer->Print(
    "#include <google/protobuf/repeated_field.h>\n"
    "#include <google/protobuf/extension_set.h>\n");

  if (HasDescriptorMethods(file_) && HasEnumDefinitions(file_)) {
    printer->Print(
      "#include <google/protobuf/generated_enum_reflection.h>\n");
  }

  if (HasGenericServices(file_)) {
    printer->Print(
      "#include <google/protobuf/service.h>\n");
  }

  if (HasUnknownFields(file_) && file_->message_type_count() > 0) {
    printer->Print(
      "#include <google/protobuf/unknown_field_set.h>\n");
  }


  for (int i = 0; i < file_->dependency_count(); i++) {
    printer->Print(
      "#include \"$dependency$.pb.h\"\n",
      "dependency", StripProto(file_->dependency(i)->name()));
  }


  printer->Print(
    "// @@protoc_insertion_point(includes)\n");


  // Open namespace.
  GenerateNamespaceOpeners(printer);

  // Forward-declare the AddDescriptors, AssignDescriptors, and ShutdownFile
  // functions, so that we can declare them to be friends of each class.
  printer->Print(
    "\n"
    "// Internal implementation detail -- do not call these.\n"
    "void $dllexport_decl$ $adddescriptorsname$();\n",
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()),
    "dllexport_decl", options_.dllexport_decl);

  printer->Print(
    // Note that we don't put dllexport_decl on these because they are only
    // called by the .pb.cc file in which they are defined.
    "void $assigndescriptorsname$();\n"
    "void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()),
    "shutdownfilename", GlobalShutdownFileName(file_->name()));

  // Generate forward declarations of classes.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateForwardDeclaration(printer);
  }

  printer->Print("\n");

  // Generate enum definitions.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateEnumDefinitions(printer);
  }
  for (int i = 0; i < file_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(kThickSeparator);
  printer->Print("\n");

  // Generate class definitions.
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (i > 0) {
      printer->Print("\n");
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateClassDefinition(printer);
  }

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  if (HasGenericServices(file_)) {
    // Generate service definitions.
    for (int i = 0; i < file_->service_count(); i++) {
      if (i > 0) {
        printer->Print("\n");
        printer->Print(kThinSeparator);
        printer->Print("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
  }

  // Declare extension identifiers.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  // Generate class inline methods.
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (i > 0) {
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateInlineMethods(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  // Close up namespace.
  GenerateNamespaceClosers(printer);

  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasDescriptorMethods(file_)) {
    // The SWIG conditional is to avoid a null-pointer dereference
    // (bug 1984964) in swig-1.3.21 resulting from the following syntax:
    //   namespace X { void Y<Z::W>(); }
    // which appears in GetEnumDescriptor() specializations.
    printer->Print(
        "\n"
        "#ifndef SWIG\n"
        "namespace google {\nnamespace protobuf {\n"
        "\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    printer->Print(
        "\n"
        "}  // namespace google\n}  // namespace protobuf\n"
        "#endif  // SWIG\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n"
    "\n");

  printer->Print(
    "#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
    "filename_identifier", filename_identifier);
}